

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O1

char * p2sc_test_file_output(char *dir,char *file)

{
  int iVar1;
  char *fmt;
  
  iVar1 = g_file_test(dir,4);
  if (iVar1 == 0) {
    fmt = "Output directory %s does not exist or is not a directory";
    iVar1 = 0x11c;
  }
  else {
    iVar1 = access(dir,2);
    if (iVar1 == 0) {
      dir = (char *)g_build_filename(dir,file,0);
      iVar1 = g_file_test(dir,1);
      if (iVar1 != 0) {
        iVar1 = access(dir,2);
        if (iVar1 != 0) {
          fmt = "Output file %s is not writable";
          iVar1 = 0x120;
          goto LAB_001138e1;
        }
      }
      return dir;
    }
    fmt = "Output directory %s is not writable";
    iVar1 = 0x117;
  }
LAB_001138e1:
  _p2sc_msg("p2sc_test_file_output",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,dir);
  exit(1);
}

Assistant:

char *p2sc_test_file_output(const char *dir, const char *file) {
    char *name = NULL;

    if (g_file_test(dir, G_FILE_TEST_IS_DIR)) {
        if (access(dir, W_OK))
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "Output directory %s is not writable", dir);
        else
            name = g_build_filename(dir, file, NULL);
    } else
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "Output directory %s does not exist or is not a directory", dir);

    if (g_file_test(name, G_FILE_TEST_IS_REGULAR)) {
        if (access(name, W_OK))
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "Output file %s is not writable", name);
    }

    return name;
}